

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ObjWhatFanin(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanin)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  
  if (pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff) == pFanin) {
    iVar1 = 0;
  }
  else if (pObj + -(ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) == pFanin) {
    iVar1 = 1;
  }
  else {
    if (p->pMuxes == (uint *)0x0) {
      pGVar2 = (Gia_Obj_t *)0x0;
    }
    else {
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar3 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar3 = uVar3 >> 1;
      if (p->nObjs <= (int)uVar3) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pGVar2 + uVar3;
    }
    iVar1 = 2;
    if (pGVar2 != pFanin) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x21b,"int Gia_ObjWhatFanin(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
  }
  return iVar1;
}

Assistant:

static inline int          Gia_ObjWhatFanin( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanin )  { if ( Gia_ObjFanin0(pObj) == pFanin ) return 0; if ( Gia_ObjFanin1(pObj) == pFanin ) return 1; if ( Gia_ObjFanin2(p, pObj) == pFanin ) return 2; assert(0); return -1; }